

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

double __thiscall CLIntercept::log(CLIntercept *this,double __x)

{
  char cVar1;
  string logString;
  
  if ((this->m_Config).SuppressLogging == false) {
    logString._M_dataplus._M_p = (pointer)&logString.field_2;
    std::__cxx11::string::_M_construct((ulong)&logString,(char)(this->m_Config).LogIndent);
    std::__cxx11::string::append((string *)&logString);
    if ((this->m_Config).LogToFile == true) {
      std::operator<<((ostream *)&this->m_InterceptLog,(string *)&logString);
      if ((this->m_Config).FlushFiles == true) {
        std::ostream::flush();
      }
    }
    cVar1 = (this->m_Config).LogToDebugger;
    if ((bool)cVar1 == true) {
      OS::Services_Common::OutputDebugString(&(this->m_OS).super_Services_Common,&logString);
      cVar1 = (this->m_Config).LogToDebugger;
    }
    if (cVar1 == '\0' && (this->m_Config).LogToFile == false) {
      std::operator<<((ostream *)&std::cerr,(string *)&logString);
    }
    __x = (double)std::__cxx11::string::~string((string *)&logString);
  }
  return __x;
}

Assistant:

void CLIntercept::log( const std::string& s )
{
    if( m_Config.SuppressLogging == false )
    {
        std::string logString( m_Config.LogIndent, ' ' );
        logString += s;
        if( m_Config.LogToFile )
        {
            m_InterceptLog << logString;
            if( m_Config.FlushFiles )
            {
                m_InterceptLog.flush();
            }
        }
        if( m_Config.LogToDebugger )
        {
            OS().OutputDebugString( logString );
        }

        if( ( m_Config.LogToFile == false ) &&
            ( m_Config.LogToDebugger == false ) )
        {
            std::cerr << logString;
        }
    }
}